

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnotAli.cc
# Opt level: O2

void updateVectors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *seqs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *seqs2,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *names,string *input_file,string *input_type)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  istream *piVar7;
  long lVar8;
  ostream *poVar9;
  size_type *psVar10;
  ulong uVar11;
  string *this;
  size_type sVar12;
  uint uVar13;
  size_type sVar14;
  uint local_45c;
  string str2;
  string temp;
  string type;
  string temp2;
  string str;
  ifstream in;
  
  std::__cxx11::string::string((string *)&type,(string *)input_type);
  for (sVar12 = 0; type._M_string_length != sVar12; sVar12 = sVar12 + 1) {
    iVar5 = toupper((int)type._M_dataplus._M_p[sVar12]);
    type._M_dataplus._M_p[sVar12] = (char)iVar5;
  }
  bVar3 = std::operator==(&type,"FASTA");
  if (bVar3) {
    std::ifstream::ifstream(&in,(input_file->_M_dataplus)._M_p,_S_in);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    iVar5 = -1;
    do {
      while( true ) {
        bVar3 = false;
        while( true ) {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&in,(string *)&str);
          sVar12 = str._M_string_length;
          _Var2 = str._M_dataplus;
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
            std::ifstream::close();
            this = &str;
            goto LAB_00113fc1;
          }
          if (*str._M_dataplus._M_p != '>') break;
          std::__cxx11::string::substr((ulong)&str2,(ulong)&str);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
                     &str2);
          std::__cxx11::string::~string((string *)&str2);
          bVar3 = true;
        }
        if (bVar3) break;
        for (sVar14 = 0; sVar12 != sVar14; sVar14 = sVar14 + 1) {
          iVar6 = toupper((int)_Var2._M_p[sVar14]);
          _Var2._M_p[sVar14] = (char)iVar6;
        }
        std::__cxx11::string::string((string *)&str2,(string *)&str);
        uVar13 = (uint)str2._M_string_length;
        while (uVar13 = uVar13 - 1, -1 < (int)uVar13) {
          if (str2._M_dataplus._M_p[uVar13 & 0x7fffffff] == '-') {
            std::__cxx11::string::erase((ulong)&str2,(ulong)(uVar13 & 0x7fffffff));
          }
        }
        std::operator+(&temp,(seqs2->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + iVar5,&str2);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((seqs2->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + iVar5));
        std::operator+(&temp2,(seqs->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + iVar5,&str);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((seqs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + iVar5));
        std::__cxx11::string::~string((string *)&temp2);
        std::__cxx11::string::~string((string *)&temp);
        std::__cxx11::string::~string((string *)&str2);
      }
      for (sVar14 = 0; sVar12 != sVar14; sVar14 = sVar14 + 1) {
        iVar6 = toupper((int)_Var2._M_p[sVar14]);
        _Var2._M_p[sVar14] = (char)iVar6;
      }
      std::__cxx11::string::string((string *)&str2,(string *)&str);
      uVar13 = (uint)str2._M_string_length;
      while (uVar13 = uVar13 - 1, -1 < (int)uVar13) {
        if (str2._M_dataplus._M_p[uVar13 & 0x7fffffff] == '-') {
          std::__cxx11::string::erase((ulong)&str2,(ulong)(uVar13 & 0x7fffffff));
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(seqs2,&str2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(seqs,&str);
      iVar5 = iVar5 + 1;
      std::__cxx11::string::~string((string *)&str2);
    } while( true );
  }
  bVar3 = std::operator==(&type,"CLUSTAL");
  if (bVar3) {
    std::ifstream::ifstream(&in,(input_file->_M_dataplus)._M_p,_S_in);
    str2._M_dataplus._M_p = (pointer)&str2.field_2;
    str2._M_string_length = 0;
    str2.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&str2);
    std::__cxx11::string::substr((ulong)&str,(ulong)&str2);
    bVar3 = std::operator!=(&str,"CLUSTAL");
    std::__cxx11::string::~string((string *)&str);
    if (!bVar3) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&str2)
      ;
      bVar3 = true;
LAB_00113a5c:
      local_45c = 0;
      do {
        do {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&in,(string *)&str2);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
            std::ifstream::close();
LAB_00113fbc:
            this = &str2;
LAB_00113fc1:
            std::__cxx11::string::~string((string *)this);
            std::ifstream::~ifstream(&in);
            pbVar1 = (seqs->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar8 = ((long)(seqs->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) + 1;
            psVar10 = &pbVar1->_M_string_length;
            do {
              lVar8 = lVar8 + -1;
              if (lVar8 == 0) {
                std::__cxx11::string::~string((string *)&type);
                return;
              }
              sVar12 = *psVar10;
              psVar10 = psVar10 + 4;
            } while (sVar12 == (long)(int)pbVar1->_M_string_length);
            poVar9 = std::operator<<((ostream *)&std::cout,
                                     "All sequences must be the same length in the alignment");
            std::endl<char,std::char_traits<char>>(poVar9);
            exit(0);
          }
        } while (((names->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish ==
                  (names->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) &&
                (bVar4 = std::operator==(&str2,""), bVar4));
        bVar4 = std::operator==(&str2,"");
        if ((bVar4) || (*str2._M_dataplus._M_p == ' ')) goto LAB_00113c86;
        if (bVar3) {
          std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)&str2,_S_in);
          std::operator>>((istream *)&str,(string *)&str2);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(names,&str2);
          std::operator>>((istream *)&str,(string *)&str2);
          sVar12 = str2._M_string_length;
          _Var2 = str2._M_dataplus;
          for (sVar14 = 0; sVar12 != sVar14; sVar14 = sVar14 + 1) {
            iVar5 = toupper((int)_Var2._M_p[sVar14]);
            _Var2._M_p[sVar14] = (char)iVar5;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(seqs,&str2);
          uVar13 = (uint)str2._M_string_length;
          while (uVar13 = uVar13 - 1, -1 < (int)uVar13) {
            if (str2._M_dataplus._M_p[uVar13 & 0x7fffffff] == '-') {
              std::__cxx11::string::erase((ulong)&str2,(ulong)(uVar13 & 0x7fffffff));
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(seqs2,&str2);
        }
        else {
          std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)&str2,_S_in);
          std::operator>>((istream *)&str,(string *)&str2);
          std::operator>>((istream *)&str,(string *)&str2);
          sVar12 = str2._M_string_length;
          _Var2 = str2._M_dataplus;
          for (sVar14 = 0; sVar12 != sVar14; sVar14 = sVar14 + 1) {
            iVar5 = toupper((int)_Var2._M_p[sVar14]);
            _Var2._M_p[sVar14] = (char)iVar5;
          }
          uVar11 = (ulong)local_45c;
          std::operator+(&temp,(seqs->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + uVar11,&str2);
          std::__cxx11::string::operator=
                    ((string *)
                     ((seqs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar11),(string *)&temp);
          std::__cxx11::string::~string((string *)&temp);
          uVar13 = (uint)str2._M_string_length;
          while (uVar13 = uVar13 - 1, -1 < (int)uVar13) {
            if (str2._M_dataplus._M_p[uVar13 & 0x7fffffff] == '-') {
              std::__cxx11::string::erase((ulong)&str2,(ulong)(uVar13 & 0x7fffffff));
            }
          }
          std::operator+(&temp,(seqs2->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + uVar11,&str2);
          std::__cxx11::string::operator=
                    ((string *)
                     ((seqs2->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar11),(string *)&temp);
          std::__cxx11::string::~string((string *)&temp);
          local_45c = local_45c + 1;
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&str);
      } while( true );
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"Not a valid CLUSTAL file!");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    bVar3 = std::operator==(&type,"STOCKHOLM");
    if (bVar3) {
      std::ifstream::ifstream(&in,(input_file->_M_dataplus)._M_p,_S_in);
      str2._M_dataplus._M_p = (pointer)&str2.field_2;
      str2._M_string_length = 0;
      str2.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&str2)
      ;
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&str2)
      ;
      while( true ) {
        std::__cxx11::string::substr((ulong)&str,(ulong)&str2);
        bVar3 = std::operator==(&str,"#=GF");
        std::__cxx11::string::~string((string *)&str);
        if (!bVar3) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&in,(string *)&str2);
      }
      bVar3 = true;
      do {
        local_45c = 0;
        while( true ) {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&in,(string *)&str2);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_00113fbc;
          std::__cxx11::string::substr((ulong)&str,(ulong)&str2);
          bVar4 = std::operator==(&str,"#=GC");
          std::__cxx11::string::~string((string *)&str);
          if (bVar4) goto LAB_00113fbc;
          bVar4 = std::operator==(&str2,"");
          if ((bVar4) || (*str2._M_dataplus._M_p == ' ')) break;
          if (bVar3) {
            std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)&str2,_S_in);
            std::operator>>((istream *)&str,(string *)&str2);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(names,&str2);
            std::operator>>((istream *)&str,(string *)&str2);
            sVar12 = str2._M_string_length;
            _Var2 = str2._M_dataplus;
            for (sVar14 = 0; sVar12 != sVar14; sVar14 = sVar14 + 1) {
              iVar5 = toupper((int)_Var2._M_p[sVar14]);
              _Var2._M_p[sVar14] = (char)iVar5;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(seqs,&str2);
            uVar13 = (uint)str2._M_string_length;
            while (uVar13 = uVar13 - 1, -1 < (int)uVar13) {
              if (str2._M_dataplus._M_p[uVar13 & 0x7fffffff] == '-') {
                std::__cxx11::string::erase((ulong)&str2,(ulong)(uVar13 & 0x7fffffff));
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(seqs2,&str2);
          }
          else {
            std::__cxx11::istringstream::istringstream((istringstream *)&str,(string *)&str2,_S_in);
            std::operator>>((istream *)&str,(string *)&str2);
            std::operator>>((istream *)&str,(string *)&str2);
            sVar12 = str2._M_string_length;
            _Var2 = str2._M_dataplus;
            for (sVar14 = 0; sVar12 != sVar14; sVar14 = sVar14 + 1) {
              iVar5 = toupper((int)_Var2._M_p[sVar14]);
              _Var2._M_p[sVar14] = (char)iVar5;
            }
            uVar11 = (ulong)local_45c;
            std::operator+(&temp,(seqs->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar11,&str2);
            std::__cxx11::string::operator=
                      ((string *)
                       ((seqs->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar11),(string *)&temp);
            std::__cxx11::string::~string((string *)&temp);
            uVar13 = (uint)str2._M_string_length;
            while (uVar13 = uVar13 - 1, -1 < (int)uVar13) {
              if (str2._M_dataplus._M_p[uVar13 & 0x7fffffff] == '-') {
                std::__cxx11::string::erase((ulong)&str2,(ulong)(uVar13 & 0x7fffffff));
              }
            }
            std::operator+(&temp,(seqs2->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar11,&str2);
            std::__cxx11::string::operator=
                      ((string *)
                       ((seqs2->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar11),(string *)&temp);
            std::__cxx11::string::~string((string *)&temp);
            local_45c = local_45c + 1;
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)&str);
        }
        bVar3 = false;
      } while( true );
    }
    poVar9 = std::operator<<((ostream *)&std::cout,"Please give valid input type");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  exit(1);
LAB_00113c86:
  bVar3 = false;
  goto LAB_00113a5c;
}

Assistant:

void updateVectors(std::vector<std::string> & seqs, std::vector<std::string> &seqs2, std::vector<std::string> & names, const std::string & input_file, const std::string& input_type){
    std::string type = input_type;
    std::transform(type.begin(), type.end(), type.begin(), ::toupper);
    // Get the arguments
    if(type == "FASTA"){

        std::ifstream in(input_file.c_str());
        std::string str;
        int i = -1;
        bool newSeq = false;
        while (std::getline(in, str)) {

            if(str[0] == '>'){
                newSeq = true;
                names.push_back(str.substr(1,str.length()));
                continue;
            } 
            
            if(newSeq == true) {
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);

                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                seqs2.push_back(str2);
                seqs.push_back(str);
                i++;
                newSeq = false;
            }
            else{
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                std::string temp = seqs2[i] + str2;
                seqs2[i] = temp;
                std::string temp2 = seqs[i] + str;
                seqs[i] = temp2;
            }
        }
        in.close();

    }else if(type == "CLUSTAL"){
        
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;

        bool first = true;
        std::getline(in, str);
        if(str.substr(0,7) != "CLUSTAL"){
            std::cout << "Not a valid CLUSTAL file!" << std::endl;
            exit (EXIT_FAILURE);
        }
        std::getline(in, str);
        while (std::getline(in, str)) {
            if(names.size() == 0 && str == "") continue;

            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }
        in.close();
    }
    else if(type == "STOCKHOLM"){
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;
        bool first = true;
        std::getline(in,str);
        getline(in,str);
        while(str.substr(0,4) == "#=GF"){
            getline(in,str);
        }
        while(getline(in,str)){

            if(str.substr(0,4) == "#=GC") break;
            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }

    }
    else{
        std::cout << "Please give valid input type" << std::endl;
        exit (EXIT_FAILURE);
    }
    int length = seqs[0].length();
    for(int i=0;i<seqs.size();++i){
        if (seqs[i].length() != length){
            std::cout << "All sequences must be the same length in the alignment" << std::endl;
            exit(0);
        }
    }
}